

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ClearOneofField
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  uint32_t uVar1;
  OneofDescriptor *pOVar2;
  
  if ((field->field_0x1 & 0x10) == 0) {
    pOVar2 = (OneofDescriptor *)0x0;
  }
  else {
    pOVar2 = (field->scope_).containing_oneof;
    if (pOVar2 == (OneofDescriptor *)0x0) goto LAB_00274620;
  }
  uVar1 = GetOneofCase(this,message,pOVar2);
  if (uVar1 != field->number_) {
    return;
  }
  if ((field->field_0x1 & 0x10) == 0) {
    pOVar2 = (OneofDescriptor *)0x0;
  }
  else {
    pOVar2 = (field->scope_).containing_oneof;
    if (pOVar2 == (OneofDescriptor *)0x0) {
LAB_00274620:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0xa9a);
    }
  }
  ClearOneof(this,message,pOVar2);
  return;
}

Assistant:

void Reflection::ClearOneofField(Message* message,
                                 const FieldDescriptor* field) const {
  if (HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
}